

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall unitOps_convertible_Test::~unitOps_convertible_Test(unitOps_convertible_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitOps, convertible)
{
    unit m1{m};
    EXPECT_TRUE(m1.is_convertible(ft));
    EXPECT_TRUE(m1.is_convertible(mile));
    EXPECT_TRUE(m1.is_convertible(nm.base_units()));
    EXPECT_FALSE(m1.is_convertible(farad));
    EXPECT_FALSE(m1.is_convertible(lb));
    EXPECT_FALSE(m1.is_convertible(V.base_units()));
}